

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O0

S2Cap * __thiscall
S2MinDistanceShapeIndexTarget::GetCapBound
          (S2Cap *__return_storage_ptr__,S2MinDistanceShapeIndexTarget *this)

{
  S2ShapeIndexRegion<S2ShapeIndex> local_40;
  S2MinDistanceShapeIndexTarget *local_18;
  S2MinDistanceShapeIndexTarget *this_local;
  
  local_18 = this;
  this_local = (S2MinDistanceShapeIndexTarget *)__return_storage_ptr__;
  MakeS2ShapeIndexRegion<S2ShapeIndex>(&local_40,this->index_);
  S2ShapeIndexRegion<S2ShapeIndex>::GetCapBound(__return_storage_ptr__,&local_40);
  S2ShapeIndexRegion<S2ShapeIndex>::~S2ShapeIndexRegion(&local_40);
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2MinDistanceShapeIndexTarget::GetCapBound() {
  return MakeS2ShapeIndexRegion(index_).GetCapBound();
}